

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  MatrixOp MVar1;
  TestContext *pTVar2;
  bool bVar3;
  int iVar4;
  int vecSize;
  DataType DVar5;
  TestNode *node;
  TestNode *node_00;
  char *__s;
  long *plVar6;
  ShaderMatrixCase *pSVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  InputType IVar12;
  size_type *psVar13;
  long lVar14;
  InputTypeSpec *pIVar15;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string vecMatName;
  ShaderInput scalarIn;
  undefined4 uStack_134;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  byte local_119;
  TestNode *local_118;
  Precision local_10c;
  ulong local_108;
  char local_fb;
  char local_fa;
  char local_f9;
  ShaderInput matIn;
  string baseName;
  ShaderInput otherMatIn;
  long local_b8 [2];
  InputType local_a8;
  DataType local_a4;
  int local_a0;
  allocator<char> local_99;
  ShaderInput colVecIn;
  ShaderInput rowVecIn;
  
  lVar10 = 0;
  do {
    pIVar15 = init::reducedInputTypes;
    local_fb = init::ops[lVar10].extendedInputTypeCases;
    if ((bool)local_fb != false) {
      pIVar15 = init::extendedInputTypes;
    }
    MVar1 = init::ops[lVar10].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               init::ops[lVar10].name,init::ops[lVar10].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    local_fa = init::ops[lVar10].createInputTypeGroup;
    uVar9 = 0;
    local_108 = (ulong)MVar1;
    do {
      local_a8 = pIVar15[uVar9].type;
      local_118 = node;
      if (local_fa != '\0') {
        node_00 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   pIVar15[uVar9].name,pIVar15[uVar9].desc);
        local_118 = node_00;
        tcu::TestNode::addChild(node,node_00);
      }
      IVar12 = local_a8;
      if (local_a8 == INPUTTYPE_DYNAMIC) {
        IVar12 = INPUTTYPE_UNIFORM;
      }
      lVar14 = 0;
      do {
        local_119 = (uint)local_108 == 0x11;
        DVar5 = init::matrixTypes[lVar14];
        iVar4 = glu::getDataTypeMatrixNumColumns(DVar5);
        vecSize = glu::getDataTypeMatrixNumRows(DVar5);
        local_a4 = DVar5;
        glu::getDataTypeName(DVar5);
        local_f9 = MVar1 - OP_INVERSE < 2 && iVar4 == vecSize;
        local_119 = local_119 & iVar4 == vecSize;
        lVar8 = 0;
        local_a0 = iVar4;
        bVar3 = true;
        do {
          bVar11 = bVar3;
          local_10c = init::precisions[lVar8];
          __s = glu::getPrecisionName(local_10c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__str,__s,(allocator<char> *)&scalarIn);
          plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          psVar13 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a0.field_2._M_allocated_capacity = *psVar13;
            local_1a0.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1a0.field_2._M_allocated_capacity = *psVar13;
            local_1a0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1a0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
          psVar13 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar13) {
            vecMatName.field_2._M_allocated_capacity = *psVar13;
            vecMatName.field_2._8_8_ = plVar6[3];
          }
          else {
            vecMatName.field_2._M_allocated_capacity = *psVar13;
            vecMatName._M_dataplus._M_p = (pointer)*plVar6;
          }
          vecMatName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&vecMatName);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar13 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar13) {
            baseName.field_2._M_allocated_capacity = *psVar13;
            baseName.field_2._8_8_ = plVar6[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar13;
            baseName._M_dataplus._M_p = (pointer)*plVar6;
          }
          baseName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
            operator_delete(vecMatName._M_dataplus._M_p,vecMatName.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          matIn.inputType = local_a8;
          matIn.dataType = local_a4;
          matIn.precision = local_10c;
          if ((uint)local_108 < 4) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = (MVar1 != OP_DIV) + INPUTTYPE_UNIFORM;
            stack0xfffffffffffffec8 = CONCAT44(uStack_134,local_10c);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&__str,"Matrix-scalar case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar2,&vecMatName,&__str,&matIn,&scalarIn,(MatrixOp)local_108,true);
            tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&__str,"Matrix-scalar case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar2,&vecMatName,&__str,&matIn,&scalarIn,(MatrixOp)local_108,false);
            tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((uint)local_108 == 2) {
              DVar5 = glu::getDataTypeFloatVec(local_a0);
              colVecIn.inputType = INPUTTYPE_DYNAMIC;
              colVecIn.precision = local_10c;
              colVecIn.dataType = DVar5;
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              glu::getDataTypeName(DVar5);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&__str);
              plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar6[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_1a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&otherMatIn);
              scalarIn._0_8_ = &local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Matrix-vector case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,(string *)&scalarIn,&matIn,&colVecIn,OP_MUL,true)
              ;
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              glu::getDataTypeName(DVar5);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&__str);
              plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar6[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_1a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&otherMatIn);
              scalarIn._0_8_ = &local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Matrix-vector case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,(string *)&scalarIn,&matIn,&colVecIn,OP_MUL,false
                        );
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              DVar5 = glu::getDataTypeFloatVec(vecSize);
              rowVecIn.inputType = INPUTTYPE_DYNAMIC;
              rowVecIn.precision = local_10c;
              rowVecIn.dataType = DVar5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&otherMatIn,__s,&local_99);
              plVar6 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
              scalarIn._0_8_ = &local_130;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar13) {
                local_130._M_allocated_capacity = *psVar13;
                local_130._8_8_ = plVar6[3];
              }
              else {
                local_130._M_allocated_capacity = *psVar13;
                scalarIn._0_8_ = (size_type *)*plVar6;
              }
              unique0x00012000 = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              glu::getDataTypeName(DVar5);
              plVar6 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar13) {
                __str.field_2._M_allocated_capacity = *psVar13;
                __str.field_2._8_8_ = plVar6[3];
              }
              else {
                __str.field_2._M_allocated_capacity = *psVar13;
                __str._M_dataplus._M_p = (pointer)*plVar6;
              }
              __str._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar6[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_1a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar13) {
                vecMatName.field_2._M_allocated_capacity = *psVar13;
                vecMatName.field_2._8_8_ = plVar6[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar13;
                vecMatName._M_dataplus._M_p = (pointer)*plVar6;
              }
              vecMatName._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(otherMatIn.dataType,otherMatIn.inputType) != local_b8) {
                operator_delete((long *)CONCAT44(otherMatIn.dataType,otherMatIn.inputType),
                                local_b8[0] + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,vecMatName._M_dataplus._M_p,
                         vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
              std::__cxx11::string::append((char *)&__str);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,__str._M_dataplus._M_p,(allocator<char> *)&otherMatIn)
              ;
              scalarIn._0_8_ = &local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Vector-matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&local_1a0,(string *)&scalarIn,&rowVecIn,&matIn,OP_MUL,true);
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,vecMatName._M_dataplus._M_p,
                         vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
              std::__cxx11::string::append((char *)&__str);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,__str._M_dataplus._M_p,(allocator<char> *)&otherMatIn)
              ;
              scalarIn._0_8_ = &local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Vector-matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&local_1a0,(string *)&scalarIn,&rowVecIn,&matIn,OP_MUL,false)
              ;
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              iVar4 = 2;
              do {
                DVar5 = glu::getDataTypeMatrix(iVar4,local_a0);
                otherMatIn.precision = local_10c;
                otherMatIn.inputType = IVar12;
                otherMatIn.dataType = DVar5;
                pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
                pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                glu::getDataTypeName(DVar5);
                __str._M_dataplus._M_p = (pointer)&__str.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&__str,baseName._M_dataplus._M_p,
                           baseName._M_dataplus._M_p + baseName._M_string_length);
                std::__cxx11::string::append((char *)&__str);
                plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
                local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                psVar13 = (size_type *)(plVar6 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar13) {
                  local_1a0.field_2._M_allocated_capacity = *psVar13;
                  local_1a0.field_2._8_8_ = plVar6[3];
                }
                else {
                  local_1a0.field_2._M_allocated_capacity = *psVar13;
                  local_1a0._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_1a0._M_string_length = plVar6[1];
                *plVar6 = (long)psVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                           (allocator<char> *)&colVecIn);
                scalarIn._0_8_ = &local_130;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&scalarIn,"Matrix-matrix case","");
                ShaderMatrixCase::ShaderMatrixCase
                          (pSVar7,pTVar2,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,OP_MUL,
                           true);
                tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scalarIn._0_8_ != &local_130) {
                  operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                  operator_delete(vecMatName._M_dataplus._M_p,
                                  vecMatName.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                  operator_delete(local_1a0._M_dataplus._M_p,
                                  local_1a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != &__str.field_2) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
                pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                glu::getDataTypeName(DVar5);
                __str._M_dataplus._M_p = (pointer)&__str.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&__str,baseName._M_dataplus._M_p,
                           baseName._M_dataplus._M_p + baseName._M_string_length);
                std::__cxx11::string::append((char *)&__str);
                plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
                local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                psVar13 = (size_type *)(plVar6 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar13) {
                  local_1a0.field_2._M_allocated_capacity = *psVar13;
                  local_1a0.field_2._8_8_ = plVar6[3];
                }
                else {
                  local_1a0.field_2._M_allocated_capacity = *psVar13;
                  local_1a0._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_1a0._M_string_length = plVar6[1];
                *plVar6 = (long)psVar13;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                           (allocator<char> *)&colVecIn);
                scalarIn._0_8_ = &local_130;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&scalarIn,"Matrix-matrix case","");
                ShaderMatrixCase::ShaderMatrixCase
                          (pSVar7,pTVar2,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,OP_MUL,
                           false);
                tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scalarIn._0_8_ != &local_130) {
                  operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                  operator_delete(vecMatName._M_dataplus._M_p,
                                  vecMatName.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                  operator_delete(local_1a0._M_dataplus._M_p,
                                  local_1a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != &__str.field_2) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 != 5);
            }
            else {
switchD_005a9d58_caseD_4:
              otherMatIn.dataType = local_a4;
              otherMatIn.precision = local_10c;
              otherMatIn.inputType = IVar12;
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&__str);
              plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar6[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_1a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              scalarIn._0_8_ = &local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Matrix-matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,
                         (MatrixOp)local_108,true);
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&__str);
              plVar6 = (long *)std::__cxx11::string::append((char *)&__str);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              psVar13 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0.field_2._8_8_ = plVar6[3];
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar13;
                local_1a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_1a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar13;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              scalarIn._0_8_ = &local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&scalarIn,"Matrix-matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,
                         (MatrixOp)local_108,false);
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)scalarIn._0_8_ != &local_130) {
                operator_delete((void *)scalarIn._0_8_,local_130._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
            }
switchD_005a9d58_caseD_7:
            if (local_f9 != '\0') {
switchD_005a9d58_caseD_6:
              scalarIn.inputType = INPUTTYPE_LAST;
              scalarIn.dataType = TYPE_LAST;
              stack0xfffffffffffffec8 = CONCAT44(uStack_134,3);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a0,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_1a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&otherMatIn);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"Matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,&__str,&matIn,&scalarIn,(MatrixOp)local_108,true)
              ;
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a0,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_1a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&otherMatIn);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"Matrix case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,&__str,&matIn,&scalarIn,(MatrixOp)local_108,false
                        );
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
            }
            if ((0x12 < (uint)local_108) || ((0x58000U >> ((uint)local_108 & 0x1f) & 1) == 0))
            goto LAB_005ab2a9;
LAB_005aadba:
            scalarIn.dataType = local_a4;
            scalarIn.inputType = IVar12;
            stack0xfffffffffffffec8 = CONCAT44(uStack_134,local_10c);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&__str,"Matrix assignment case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar2,&vecMatName,&__str,&matIn,&scalarIn,(MatrixOp)local_108,true);
            tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&__str,"Matrix assignment case","");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar2,&vecMatName,&__str,&matIn,&scalarIn,(MatrixOp)local_108,false);
            tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            switch((uint)local_108) {
            case 4:
              goto switchD_005a9d58_caseD_4;
            case 5:
              scalarIn.dataType = glu::getDataTypeFloatVec(vecSize);
              scalarIn.inputType = local_a8;
              stack0xfffffffffffffec8 = CONCAT44(uStack_134,local_10c);
              otherMatIn.dataType = glu::getDataTypeFloatVec(local_a0);
              otherMatIn.precision = local_10c;
              otherMatIn.inputType = IVar12;
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a0,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_1a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&__str,"Vector-vector case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,&__str,&scalarIn,&otherMatIn,(MatrixOp)local_108,
                         true);
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a0,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&local_1a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_1a0._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&__str,"Vector-vector case","");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar2,&vecMatName,&__str,&scalarIn,&otherMatIn,(MatrixOp)local_108,
                         false);
              tcu::TestNode::addChild(local_118,(TestNode *)pSVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              break;
            case 6:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
              goto switchD_005a9d58_caseD_6;
            default:
              goto switchD_005a9d58_caseD_7;
            }
LAB_005ab2a9:
            if (local_119 != 0) goto LAB_005aadba;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          lVar8 = 1;
          bVar3 = false;
        } while (bVar11);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 9);
    } while ((uVar9 < 2) && (uVar9 = uVar9 + 1, local_fb != '\0'));
    lVar10 = lVar10 + 1;
    if (lVar10 == 0x13) {
      return 0x13;
    }
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		const MatrixOp	op;
		const bool		extendedInputTypeCases; // !< test with const and uniform types too
		const bool		createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		const InputType	type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}